

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QFont *font)

{
  quint8 qVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  QFontPrivate *pQVar6;
  long in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  double dVar7;
  QStringList value_3;
  quint8 value_2;
  quint8 value_1;
  int value;
  quint8 extendedBits;
  quint16 stretch;
  quint16 weight_1;
  quint8 weight;
  quint8 charSet;
  quint8 tempStyleStrategy;
  qint16 pixelSize_1;
  qint16 pointSize_1;
  qint32 pixelSize;
  double pointSize;
  QString fam_1;
  QByteArray fam;
  quint16 styleStrategy;
  quint8 bits;
  quint8 styleHint;
  QFontPrivate *in_stack_fffffffffffffeb8;
  QFontPrivate *in_stack_fffffffffffffec0;
  QDataStream *s_00;
  QList<QString> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  int local_a8;
  quint8 local_a1;
  ushort local_a0;
  ushort local_9e;
  undefined1 local_9b;
  undefined1 local_9a;
  byte local_99;
  short local_98;
  short local_96;
  int local_94;
  double local_90 [4];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  ushort local_c;
  quint8 local_a;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0x98);
  QFontPrivate::QFontPrivate(in_stack_fffffffffffffec0);
  QExplicitlySharedDataPointer<QFontPrivate>::operator=
            ((QExplicitlySharedDataPointer<QFontPrivate> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  *(undefined4 *)(in_RSI + 8) = 0xfffff;
  local_9 = 0xaa;
  local_a = 0xaa;
  local_c = 1;
  iVar4 = QDataStream::version(in_RDI);
  if (iVar4 == 1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x71691f);
    operator>>(in_RDI,(QByteArray *)&local_28);
    QString::fromLatin1<void>((QByteArray *)in_stack_fffffffffffffec0);
    QList<QString>::QList<QString,void>
              ((QList<QString> *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8);
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716965);
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffec0,
               (QList<QString> *)in_stack_fffffffffffffeb8);
    QList<QString>::~QList((QList<QString> *)0x716986);
    QString::~QString((QString *)0x716993);
    QByteArray::~QByteArray((QByteArray *)0x7169a0);
  }
  else {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x7169df);
    operator>>(in_RDI,(QString *)&local_70);
    QList<QString>::QList<QString,void>
              ((QList<QString> *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8);
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716a10);
    QList<QString>::operator=
              ((QList<QString> *)in_stack_fffffffffffffec0,
               (QList<QString> *)in_stack_fffffffffffffeb8);
    QList<QString>::~QList((QList<QString> *)0x716a31);
    iVar4 = QDataStream::version(in_RDI);
    if (0xf < iVar4) {
      pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716a54);
      operator>>(in_RDI,(QString *)&(pQVar6->request).styleName);
    }
    QString::~QString((QString *)0x716a76);
  }
  iVar4 = QDataStream::version(in_RDI);
  if (iVar4 < 7) {
    local_96 = -0x5556;
    local_98 = -1;
    QDataStream::operator>>(in_RDI,&local_96);
    iVar4 = QDataStream::version(in_RDI);
    if (3 < iVar4) {
      QDataStream::operator>>(in_RDI,&local_98);
    }
    iVar4 = (int)local_96;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716b85);
    (pQVar6->request).pointSize = (double)iVar4 / 10.0;
    iVar4 = (int)local_98;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716bac);
    (pQVar6->request).pixelSize = (double)iVar4;
  }
  else {
    local_90[0] = -NAN;
    local_94 = -0x55555556;
    QDataStream::operator>>(in_RDI,local_90);
    QDataStream::operator>>(in_RDI,&local_94);
    dVar7 = local_90[0];
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716ae2);
    (pQVar6->request).pointSize = dVar7;
    dVar7 = (double)local_94;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716b06);
    (pQVar6->request).pixelSize = dVar7;
  }
  QDataStream::operator>>
            ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
  iVar4 = QDataStream::version(in_RDI);
  if (4 < iVar4) {
    iVar4 = QDataStream::version(in_RDI);
    if (iVar4 < 0x10) {
      local_99 = 0xaa;
      QDataStream::operator>>
                ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
      local_c = (ushort)local_99;
    }
    else {
      QDataStream::operator>>
                ((QDataStream *)in_stack_fffffffffffffec0,(quint16 *)in_stack_fffffffffffffeb8);
    }
  }
  iVar4 = QDataStream::version(in_RDI);
  if (iVar4 < 0x14) {
    local_9a = 0xaa;
    local_9b = 0xaa;
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
    uVar5 = qt_legacyToOpenTypeWeight(0);
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716c85);
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xfffc00ffffffffff |
         ((ulong)uVar5 & 0x3ff) << 0x28;
  }
  else {
    local_9e = 0xaaaa;
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint16 *)in_stack_fffffffffffffeb8);
    uVar2 = local_9e;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716ce4);
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xfffc00ffffffffff |
         ((ulong)uVar2 & 0x3ff) << 0x28;
  }
  QDataStream::operator>>
            ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
  bVar3 = local_9;
  pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716d37);
  uVar2 = local_c;
  *(ulong *)&(pQVar6->request).field_0x60 =
       *(ulong *)&(pQVar6->request).field_0x60 & 0xffffff00ffffffff | (ulong)bVar3 << 0x20;
  pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716d78);
  *(ulong *)&(pQVar6->request).field_0x60 =
       *(ulong *)&(pQVar6->request).field_0x60 & 0xffffffffffff0000 | (ulong)uVar2;
  iVar4 = QDataStream::version(in_RDI);
  qVar1 = local_a;
  pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::data
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716dbc);
  set_font_bits(iVar4,qVar1,pQVar6);
  iVar4 = QDataStream::version(in_RDI);
  if (8 < iVar4) {
    local_a0 = 0xaaaa;
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint16 *)in_stack_fffffffffffffeb8);
    uVar2 = local_a0;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716e10);
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xfffffffff000ffff |
         ((ulong)uVar2 & 0xfff) << 0x10;
  }
  iVar4 = QDataStream::version(in_RDI);
  if (9 < iVar4) {
    local_a1 = 0xaa;
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
    qVar1 = local_a1;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::data
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716e73);
    set_extended_font_bits(qVar1,pQVar6);
  }
  iVar4 = QDataStream::version(in_RDI);
  if (10 < iVar4) {
    local_a8 = -0x55555556;
    QDataStream::operator>>(in_RDI,&local_a8);
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716eb8);
    QFixed::setValue(&pQVar6->letterSpacing,local_a8);
    QDataStream::operator>>(in_RDI,&local_a8);
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716eea);
    QFixed::setValue(&pQVar6->wordSpacing,local_a8);
  }
  iVar4 = QDataStream::version(in_RDI);
  if (0xf < iVar4) {
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed4 = 0xaa;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716f3f);
    *(ulong *)&(pQVar6->request).field_0x60 =
         *(ulong *)&(pQVar6->request).field_0x60 & 0xffffffff3fffffff |
         ((ulong)in_stack_fffffffffffffed4 & 3) << 0x1e;
  }
  iVar4 = QDataStream::version(in_RDI);
  if (0x10 < iVar4) {
    QDataStream::operator>>
              ((QDataStream *)in_stack_fffffffffffffec0,(quint8 *)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed0 = 0xaa;
    pQVar6 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QFontPrivate> *)0x716fa6);
    pQVar6->field_0x7c = pQVar6->field_0x7c & 0x8f | ((byte)in_stack_fffffffffffffed0 & 7) << 4;
  }
  iVar4 = QDataStream::version(in_RDI);
  if (0x12 < iVar4) {
    QList<QString>::QList((QList<QString> *)0x71700a);
    operator>>((QDataStream *)in_stack_fffffffffffffec0,(QList<QString> *)in_stack_fffffffffffffeb8)
    ;
    iVar4 = QDataStream::version(in_RDI);
    if (iVar4 < 0x14) {
      QExplicitlySharedDataPointer<QFontPrivate>::operator->
                ((QExplicitlySharedDataPointer<QFontPrivate> *)0x717035);
      QList<QString>::append
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
    }
    else {
      QExplicitlySharedDataPointer<QFontPrivate>::operator->
                ((QExplicitlySharedDataPointer<QFontPrivate> *)0x717055);
      QList<QString>::operator=
                ((QList<QString> *)in_stack_fffffffffffffec0,
                 (QList<QString> *)in_stack_fffffffffffffeb8);
    }
    QList<QString>::~QList((QList<QString> *)0x717076);
  }
  iVar4 = QDataStream::version(in_RDI);
  if (0x14 < iVar4) {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71708f);
    QHash<QFont::Tag,_unsigned_int>::clear
              ((QHash<QFont::Tag,_unsigned_int> *)in_stack_fffffffffffffec0);
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7170b2);
    operator>>((QDataStream *)in_stack_fffffffffffffec0,
               (QHash<QFont::Tag,_unsigned_int> *)in_stack_fffffffffffffeb8);
  }
  iVar4 = QDataStream::version(in_RDI);
  if (0x15 < iVar4) {
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7170df);
    QMap<QFont::Tag,_float>::clear((QMap<QFont::Tag,_float> *)in_stack_fffffffffffffec0);
    s_00 = in_RDI;
    QExplicitlySharedDataPointer<QFontPrivate>::operator->
              ((QExplicitlySharedDataPointer<QFontPrivate> *)0x717103);
    operator>>(s_00,(QMap<QFont::Tag,_float> *)in_stack_fffffffffffffeb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &s, QFont &font)
{
    font.d = new QFontPrivate;
    font.resolve_mask = QFont::AllPropertiesResolved;

    quint8 styleHint, bits;
    quint16 styleStrategy = QFont::PreferDefault;

    if (s.version() == 1) {
        QByteArray fam;
        s >> fam;
        font.d->request.families = QStringList(QString::fromLatin1(fam));
    } else {
        QString fam;
        s >> fam;
        font.d->request.families = QStringList(fam);
        if (s.version() >= QDataStream::Qt_5_4)
            s >> font.d->request.styleName;
    }

    if (s.version() >= QDataStream::Qt_4_0) {
        // 4.0
        double pointSize;
        qint32 pixelSize;
        s >> pointSize;
        s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize);
        font.d->request.pixelSize = pixelSize;
    } else {
        qint16 pointSize, pixelSize = -1;
        s >> pointSize;
        if (s.version() >= 4)
            s >> pixelSize;
        font.d->request.pointSize = qreal(pointSize / 10.);
        font.d->request.pixelSize = pixelSize;
    }
    s >> styleHint;
    if (s.version() >= QDataStream::Qt_3_1) {
        if (s.version() >= QDataStream::Qt_5_4) {
            s >> styleStrategy;
        } else {
            quint8 tempStyleStrategy;
            s >> tempStyleStrategy;
            styleStrategy = tempStyleStrategy;
        }
    }

    if (s.version() < QDataStream::Qt_6_0) {
        quint8 charSet;
        quint8 weight;
        s >> charSet;
        s >> weight;
        font.d->request.weight = qt_legacyToOpenTypeWeight(weight);
    } else {
        quint16 weight;
        s >> weight;
        font.d->request.weight = weight;
    }

    s >> bits;

    font.d->request.styleHint = styleHint;
    font.d->request.styleStrategy = styleStrategy;

    set_font_bits(s.version(), bits, font.d.data());

    if (s.version() >= QDataStream::Qt_4_3) {
        quint16 stretch;
        s >> stretch;
        font.d->request.stretch = stretch;
    }

    if (s.version() >= QDataStream::Qt_4_4) {
        quint8 extendedBits;
        s >> extendedBits;
        set_extended_font_bits(extendedBits, font.d.data());
    }
    if (s.version() >= QDataStream::Qt_4_5) {
        int value;
        s >> value;
        font.d->letterSpacing.setValue(value);
        s >> value;
        font.d->wordSpacing.setValue(value);
    }
    if (s.version() >= QDataStream::Qt_5_4) {
        quint8 value;
        s >> value;
        font.d->request.hintingPreference = QFont::HintingPreference(value);
    }
    if (s.version() >= QDataStream::Qt_5_6) {
        quint8 value;
        s >> value;
        font.d->capital = QFont::Capitalization(value);
    }
    if (s.version() >= QDataStream::Qt_5_13) {
        QStringList value;
        s >> value;
        if (s.version() < QDataStream::Qt_6_0)
            font.d->request.families.append(value);
        else
            font.d->request.families = value;
    }
    if (s.version() >= QDataStream::Qt_6_6) {
        font.d->features.clear();
        s >> font.d->features;
    }
    if (s.version() >= QDataStream::Qt_6_7) {
        font.d->request.variableAxisValues.clear();
        s >> font.d->request.variableAxisValues;
    }

    return s;
}